

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOHasPath(FmsIOContext *ctx,char *path)

{
  int iVar1;
  long __off;
  char *pcVar2;
  int iVar3;
  char k [512];
  char acStack_228 [512];
  
  iVar3 = 1;
  if (ctx != (FmsIOContext *)0x0) {
    if (path == (char *)0x0) {
      iVar3 = 2;
    }
    else {
      __off = ftell((FILE *)ctx->fp);
      if (__off < 0) {
        iVar3 = 3;
      }
      else {
        iVar1 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,acStack_228,(char *)0x0);
        fseek((FILE *)ctx->fp,__off,0);
        if (iVar1 == 2) {
LAB_0010f02f:
          iVar3 = 0;
        }
        else if (iVar1 == 0) {
          iVar1 = strcmp(acStack_228,path);
          while (iVar1 != 0) {
            pcVar2 = strrchr(acStack_228,0x2f);
            if (pcVar2 == (char *)0x0) goto LAB_0010f02f;
            *pcVar2 = '\0';
            iVar1 = strcmp(acStack_228,path);
          }
        }
        else {
          iVar3 = 4;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
FmsIOHasPath(FmsIOContext *ctx, const char *path) {
  int err = 0;
  char k[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);

  long cur_loc = ftell(ctx->fp);
  if(cur_loc < 0)
    E_RETURN(3);
  err = FmsIOReadKeyValue(ctx, k, NULL);
  fseek(ctx->fp, cur_loc, SEEK_SET);
  // EoF, not an error in this context - just means return false.
  if(err == 2)
    return 0;
  else if(err)
    E_RETURN(4);

  // Need to find each / from the right and compare each time to match conduit functionality
  int found = 0;
  while(1) {
    if(strcmp(k, path) == 0) {
      found = 1;
      break;
    }
    char *ptr = strrchr(k, '/');
    if(ptr == NULL)
      break;
    *ptr = '\0';
  }
  return found;

}